

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw-schema.h
# Opt level: O0

void __thiscall capnp::_::RawSchema::ensureInitialized(RawSchema *this)

{
  Initializer *pIVar1;
  Initializer *i;
  RawSchema *this_local;
  
  pIVar1 = this->lazyInitializer;
  if (pIVar1 != (Initializer *)0x0) {
    (**pIVar1->_vptr_Initializer)(pIVar1,this);
  }
  return;
}

Assistant:

inline void ensureInitialized() const {
    // Lazy initialization support.  Invoke to ensure that initialization has taken place.  This
    // is required in particular when traversing the dependency list.  RawSchemas for compiled-in
    // types are always initialized; only dynamically-loaded schemas may be lazy.

#if __GNUC__ || defined(__clang__)
    const Initializer* i = __atomic_load_n(&lazyInitializer, __ATOMIC_ACQUIRE);
#elif _MSC_VER
    const Initializer* i = *static_cast<Initializer const* const volatile*>(&lazyInitializer);
    std::atomic_thread_fence(std::memory_order_acquire);
#else
#error "Platform not supported"
#endif
    if (i != nullptr) i->init(this);
  }